

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O1

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_SetInputMessageCallbackImpl
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,char *inputName,
          IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC eventHandlerCallback,
          IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC_EX eventHandlerCallbackEx,void *userContextCallback,
          void *userContextCallbackEx,size_t userContextCallbackExLength)

{
  bool bVar1;
  int iVar2;
  LIST_ITEM_HANDLE pLVar3;
  IOTHUB_EVENT_CALLBACK *pIVar4;
  LOGGER_LOG p_Var5;
  SINGLYLINKEDLIST_HANDLE pSVar6;
  STRING_HANDLE pSVar7;
  void *pvVar8;
  char *pcVar9;
  IOTHUB_CLIENT_RESULT IVar10;
  char *pcVar11;
  bool bVar12;
  
  if (iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return IOTHUB_CLIENT_INVALID_ARG;
    }
    pcVar9 = "IoTHubClientCore_LL_SetInputMessageCallbackImpl";
    pcVar11 = "Invalid argument - iotHubClientHandle=%p, inputName=%p";
    IVar10 = IOTHUB_CLIENT_INVALID_ARG;
    iVar2 = 0xcad;
    goto LAB_00121e22;
  }
  pSVar6 = iotHubClientHandle->event_callbacks;
  if (eventHandlerCallback == (IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC)0x0 &&
      eventHandlerCallbackEx == (IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC_EX)0x0) {
    pLVar3 = singlylinkedlist_find(pSVar6,is_event_equal_for_match,inputName);
    if (pLVar3 == (LIST_ITEM_HANDLE)0x0) {
      p_Var5 = xlogging_get_log_function();
      IVar10 = IOTHUB_CLIENT_ERROR;
      if (p_Var5 == (LOGGER_LOG)0x0) {
        return IOTHUB_CLIENT_ERROR;
      }
      pcVar9 = "remove_event_unsubscribe_if_needed";
      pcVar11 = "Input name %s was not present";
      iVar2 = 0xc85;
    }
    else {
      pIVar4 = (IOTHUB_EVENT_CALLBACK *)singlylinkedlist_item_get_value(pLVar3);
      if (pIVar4 == (IOTHUB_EVENT_CALLBACK *)0x0) {
        p_Var5 = xlogging_get_log_function();
        IVar10 = IOTHUB_CLIENT_ERROR;
        if (p_Var5 == (LOGGER_LOG)0x0) {
          return IOTHUB_CLIENT_ERROR;
        }
        pcVar9 = "remove_event_unsubscribe_if_needed";
        pcVar11 = "singlylinkedlist_item_get_value failed";
        iVar2 = 0xc8d;
      }
      else {
        delete_event(pIVar4);
        iVar2 = singlylinkedlist_remove(iotHubClientHandle->event_callbacks,pLVar3);
        if (iVar2 == 0) {
          pLVar3 = singlylinkedlist_get_head_item(iotHubClientHandle->event_callbacks);
          if (pLVar3 != (LIST_ITEM_HANDLE)0x0) {
            return IOTHUB_CLIENT_OK;
          }
          (*iotHubClientHandle->IoTHubTransport_Unsubscribe_InputQueue)
                    (iotHubClientHandle->deviceHandle);
          return IOTHUB_CLIENT_OK;
        }
        p_Var5 = xlogging_get_log_function();
        IVar10 = IOTHUB_CLIENT_ERROR;
        if (p_Var5 == (LOGGER_LOG)0x0) {
          return IOTHUB_CLIENT_ERROR;
        }
        pcVar9 = "remove_event_unsubscribe_if_needed";
        pcVar11 = "singlylinkedlist_remove failed";
        iVar2 = 0xc95;
      }
    }
    goto LAB_00121e22;
  }
  if (pSVar6 == (SINGLYLINKEDLIST_HANDLE)0x0) {
    bVar12 = false;
  }
  else {
    pLVar3 = singlylinkedlist_get_head_item(pSVar6);
    bVar12 = pLVar3 != (LIST_ITEM_HANDLE)0x0;
  }
  if (iotHubClientHandle->event_callbacks == (SINGLYLINKEDLIST_HANDLE)0x0) {
    pSVar6 = singlylinkedlist_create();
    iotHubClientHandle->event_callbacks = pSVar6;
    if (pSVar6 != (SINGLYLINKEDLIST_HANDLE)0x0) goto LAB_00121af0;
    p_Var5 = xlogging_get_log_function();
    IVar10 = IOTHUB_CLIENT_ERROR;
    if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_00121d90;
    bVar1 = false;
    (*p_Var5)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
              ,"create_event_handler_callback",0xc2b,1,
              "Could not allocate linked list for callbacks");
  }
  else {
LAB_00121af0:
    pLVar3 = singlylinkedlist_find
                       (iotHubClientHandle->event_callbacks,is_event_equal_for_match,inputName);
    if (pLVar3 == (LIST_ITEM_HANDLE)0x0) {
      pIVar4 = (IOTHUB_EVENT_CALLBACK *)malloc(0x28);
      if (pIVar4 == (IOTHUB_EVENT_CALLBACK *)0x0) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 != (LOGGER_LOG)0x0) {
          pcVar9 = "Could not allocate IOTHUB_EVENT_CALLBACK";
          iVar2 = 0xc37;
          goto LAB_00121c57;
        }
LAB_00121c64:
        pIVar4 = (IOTHUB_EVENT_CALLBACK *)0x0;
        goto LAB_00121c67;
      }
      pIVar4->callbackAsyncEx = (IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC_EX)0x0;
      pIVar4->userContextCallback = (void *)0x0;
      pIVar4->inputName = (STRING_HANDLE)0x0;
      pIVar4->callbackAsync = (IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC)0x0;
      pIVar4->userContextCallbackEx = (void *)0x0;
      bVar1 = true;
    }
    else {
      pIVar4 = (IOTHUB_EVENT_CALLBACK *)singlylinkedlist_item_get_value(pLVar3);
      if (pIVar4 == (IOTHUB_EVENT_CALLBACK *)0x0) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_00121c64;
        pcVar9 = "singlylinkedlist_item_get_value failed looking up event callback";
        iVar2 = 0xc45;
LAB_00121c57:
        pIVar4 = (IOTHUB_EVENT_CALLBACK *)0x0;
        (*p_Var5)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"create_event_handler_callback",iVar2,1,pcVar9);
      }
LAB_00121c67:
      bVar1 = false;
    }
    if (pIVar4 != (IOTHUB_EVENT_CALLBACK *)0x0) {
      if (inputName == (char *)0x0) {
LAB_00121ca0:
        pIVar4->callbackAsync = eventHandlerCallback;
        pIVar4->callbackAsyncEx = eventHandlerCallbackEx;
        free(pIVar4->userContextCallbackEx);
        pIVar4->userContextCallbackEx = (void *)0x0;
        if (userContextCallbackEx == (void *)0x0) {
          pIVar4->userContextCallback = userContextCallback;
LAB_00121d1e:
          if ((!bVar1) ||
             (pLVar3 = singlylinkedlist_add(iotHubClientHandle->event_callbacks,pIVar4),
             pLVar3 != (LIST_ITEM_HANDLE)0x0)) {
            bVar1 = true;
            IVar10 = IOTHUB_CLIENT_OK;
            if (userContextCallbackEx != (void *)0x0) {
              memcpy(pIVar4->userContextCallbackEx,userContextCallbackEx,userContextCallbackExLength
                    );
              IVar10 = IOTHUB_CLIENT_OK;
            }
            goto LAB_00121d93;
          }
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_00121d88;
          pcVar9 = "Unable to add eventCallback to list";
          iVar2 = 0xc66;
        }
        else {
          pvVar8 = malloc(userContextCallbackExLength);
          pIVar4->userContextCallbackEx = pvVar8;
          if (pvVar8 != (void *)0x0) goto LAB_00121d1e;
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_00121d88;
          pcVar9 = "Unable to allocate userContextCallback";
          iVar2 = 0xc60;
        }
        (*p_Var5)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                  ,"create_event_handler_callback",iVar2,1,pcVar9);
      }
      else {
        if (pIVar4->inputName == (STRING_HANDLE)0x0) {
          pSVar7 = STRING_construct(inputName);
          pIVar4->inputName = pSVar7;
        }
        if (pIVar4->inputName != (STRING_HANDLE)0x0) goto LAB_00121ca0;
      }
LAB_00121d88:
      delete_event(pIVar4);
    }
LAB_00121d90:
    bVar1 = false;
    IVar10 = IOTHUB_CLIENT_ERROR;
  }
LAB_00121d93:
  if (bVar1) {
    if (bVar12) {
      return IOTHUB_CLIENT_OK;
    }
    iVar2 = (*iotHubClientHandle->IoTHubTransport_Subscribe_InputQueue)
                      (iotHubClientHandle->deviceHandle);
    if (iVar2 == 0) {
      return IOTHUB_CLIENT_OK;
    }
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_SetInputMessageCallbackImpl",0xcc0,1,
                "IoTHubTransport_Subscribe_InputQueue failed");
    }
    delete_event_callback_list(iotHubClientHandle);
    return IOTHUB_CLIENT_ERROR;
  }
  p_Var5 = xlogging_get_log_function();
  if (p_Var5 == (LOGGER_LOG)0x0) {
    return IVar10;
  }
  pcVar9 = "IoTHubClientCore_LL_SetInputMessageCallbackImpl";
  pcVar11 = "create_event_handler_callback call failed, error = %d";
  iVar2 = 0xcbc;
LAB_00121e22:
  (*p_Var5)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
            ,pcVar9,iVar2,1,pcVar11);
  return IVar10;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_SetInputMessageCallbackImpl(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, const char* inputName, IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC eventHandlerCallback, IOTHUB_CLIENT_MESSAGE_CALLBACK_ASYNC_EX eventHandlerCallbackEx, void *userContextCallback, void *userContextCallbackEx, size_t userContextCallbackExLength)
{
    IOTHUB_CLIENT_RESULT result;

    if (iotHubClientHandle == NULL)
    {
        LogError("Invalid argument - iotHubClientHandle=%p, inputName=%p", iotHubClientHandle, inputName);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)iotHubClientHandle;
        if ((eventHandlerCallback == NULL) && (eventHandlerCallbackEx == NULL))
        {
            result = (IOTHUB_CLIENT_RESULT)remove_event_unsubscribe_if_needed(handleData, inputName);
        }
        else
        {
            bool registered_with_transport_handler = (handleData->event_callbacks != NULL) && (singlylinkedlist_get_head_item(handleData->event_callbacks) != NULL);
            if ((result = (IOTHUB_CLIENT_RESULT)create_event_handler_callback(handleData, inputName, eventHandlerCallback, eventHandlerCallbackEx, userContextCallback, userContextCallbackEx, userContextCallbackExLength)) != IOTHUB_CLIENT_OK)
            {
                LogError("create_event_handler_callback call failed, error = %d", result);
            }
            else if (!registered_with_transport_handler && (handleData->IoTHubTransport_Subscribe_InputQueue(handleData->deviceHandle) != 0))
            {
                LogError("IoTHubTransport_Subscribe_InputQueue failed");
                delete_event_callback_list(handleData);
                result = IOTHUB_CLIENT_ERROR;
            }
            else
            {
                result = IOTHUB_CLIENT_OK;
            }
        }
    }
    return result;

}